

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *p;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int local_b0;
  char aFold [64];
  
  p = aFold;
  local_b0 = 0x40;
  iVar4 = 0;
  iVar5 = 0;
  while( true ) {
    if ((nText <= iVar5) || (iVar4 != 0)) break;
    iVar11 = iVar5 + 2;
    iVar13 = -iVar5;
    lVar6 = 0;
    iVar9 = iVar5;
    while( true ) {
      iVar4 = 0;
      if ((long)nText - (long)iVar5 == lVar6) goto LAB_0019b1af;
      if (((long)pText[lVar6 + iVar5] < 0) ||
         (pTokenizer[pText[lVar6 + iVar5]] != (Fts5Tokenizer)0x0)) break;
      lVar6 = lVar6 + 1;
      iVar11 = iVar11 + 1;
      iVar9 = iVar9 + 1;
      iVar13 = iVar13 + -1;
    }
    iVar3 = (int)lVar6;
    if (nText - iVar5 == iVar3) break;
    uVar12 = iVar5 + iVar3 + 1;
    if ((int)uVar12 < nText) {
      uVar12 = nText;
    }
    lVar10 = (long)iVar9;
    while (lVar10 = lVar10 + 1, lVar10 < nText) {
      if ((-1 < (long)pText[lVar10]) && (pTokenizer[pText[lVar10]] == (Fts5Tokenizer)0x0)) {
        uVar12 = iVar11 - 1;
        break;
      }
      iVar11 = iVar11 + 1;
    }
    uVar7 = ((ulong)(uint)-iVar5 + (ulong)uVar12) - lVar6;
    iVar4 = (int)uVar7;
    if (local_b0 < iVar4) {
      if (p != aFold) {
        sqlite3_free(p);
      }
      p = (char *)sqlite3_malloc64((uVar7 & 0xffffffff) * 2);
      if (p == (char *)0x0) {
        p = (char *)0x0;
        iVar4 = 7;
        goto LAB_0019b1b9;
      }
      local_b0 = iVar4 * 2;
    }
    uVar2 = iVar13 + uVar12;
    if ((int)(iVar13 + uVar12) < 1) {
      uVar2 = 0;
    }
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      bVar1 = pText[uVar7 + (long)iVar9];
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      p[uVar7] = bVar8;
    }
    iVar4 = (*xToken)(pCtx,0,p,iVar4,iVar5 + iVar3,uVar12);
    iVar5 = iVar11;
  }
LAB_0019b1af:
  if (p != aFold) {
LAB_0019b1b9:
    sqlite3_free(p);
  }
  iVar5 = 0;
  if (iVar4 != 0x65) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }
  
  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}